

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

string * __thiscall
kratos::InterfaceDefinition::var
          (string *__return_storage_ptr__,InterfaceDefinition *this,string *name,uint32_t width,
          uint32_t size)

{
  initializer_list<unsigned_int> __l;
  allocator<unsigned_int> local_55;
  uint32_t local_54;
  iterator local_50;
  size_type local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t size_local;
  uint32_t width_local;
  string *name_local;
  InterfaceDefinition *this_local;
  
  local_50 = &local_54;
  local_48 = 1;
  local_54 = size;
  local_28 = size;
  local_24 = width;
  _size_local = name;
  name_local = (string *)this;
  this_local = (InterfaceDefinition *)__return_storage_ptr__;
  std::allocator<unsigned_int>::allocator(&local_55);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,__l,&local_55);
  var(__return_storage_ptr__,this,name,width,&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  std::allocator<unsigned_int>::~allocator(&local_55);
  return __return_storage_ptr__;
}

Assistant:

std::string InterfaceDefinition::var(const std::string& name, uint32_t width, uint32_t size) {
    return var(name, width, std::vector<uint32_t>{size});
}